

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O3

Utest * __thiscall
TEST_SimpleString_Addition_TestShell::createTest(TEST_SimpleString_Addition_TestShell *this)

{
  TEST_SimpleString_Addition_Test *this_00;
  
  this_00 = (TEST_SimpleString_Addition_Test *)
            operator_new(0x38,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
                         ,0x131);
  TEST_SimpleString_Addition_Test::TEST_SimpleString_Addition_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(SimpleString, Addition)
{
    SimpleString s1("hello!");
    SimpleString s2("goodbye!");
    SimpleString s3("hello!goodbye!");
    SimpleString s4;
    s4 = s1 + s2;

    CHECK_EQUAL(s3, s4);
}